

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O1

bool from_issue_266::test_uintwide_t_spot_values_from_issue_266_inc(void)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  array<unsigned_int,_4UL> aVar4;
  bool bVar5;
  long lVar6;
  byte bVar7;
  local_uint128_t inc_value;
  local_uint128_t inc_value_p;
  array<unsigned_int,_4UL> local_38;
  array<unsigned_int,_4UL> local_28;
  value_type_conflict local_18 [6];
  
  local_28.elems[0] = 0;
  local_28.elems[1] = 0;
  local_28.elems[2] = 0;
  local_28.elems[3] = 0;
  bVar5 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::rd_string
                    ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_28,
                     "0x0000000000000001FFFFFFFFFFFFFFFF",0xffffffffffffffff,0);
  if (!bVar5) {
    local_28.elems[2] = 0xffffffff;
    local_28.elems[0] = 0xffffffff;
    local_28.elems[1] = 0xffffffff;
    local_28.elems[3] = 0xffffffff;
  }
  aVar4.elems = local_28.elems;
  local_38.elems[0] = local_28.elems[0];
  local_38.elems[1] = local_28.elems[1];
  local_38.elems[2] = local_28.elems[2];
  local_38.elems[3] = local_28.elems[3];
  lVar6 = 0;
  local_28.elems = aVar4.elems;
  do {
    piVar1 = (int *)((long)local_38.elems + lVar6);
    *piVar1 = *piVar1 + 1;
    if (*piVar1 != 0) break;
    bVar5 = lVar6 != 0xc;
    lVar6 = lVar6 + 4;
  } while (bVar5);
  local_18[0] = local_38.elems[0];
  local_18[1] = local_38.elems[1];
  local_18[2] = local_38.elems[2];
  local_18[3] = local_38.elems[3];
  lVar6 = 0xc;
  do {
    bVar7 = 0;
    if (lVar6 == -4) break;
    puVar2 = (uint *)((long)local_18 + lVar6);
    uVar3 = *(uint *)((long)local_28.elems + lVar6);
    bVar7 = -(*puVar2 <= uVar3) | 1;
    lVar6 = lVar6 + -4;
  } while (*puVar2 == uVar3);
  if (bVar7 == 1) {
    local_38.elems[0] = 0;
    local_38.elems[1] = 0;
    local_38.elems[2] = 0;
    local_38.elems[3] = 0;
    bVar5 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::rd_string
                      ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_38,
                       "0x00000000000000020000000000000000",0xffffffffffffffff,0);
    if (!bVar5) {
      local_38.elems[2] = 0xffffffff;
      local_38.elems[0] = 0xffffffff;
      local_38.elems[1] = 0xffffffff;
      local_38.elems[3] = 0xffffffff;
    }
    lVar6 = 0xc;
    do {
      bVar7 = 0;
      if (lVar6 == -4) break;
      puVar2 = (uint *)((long)local_18 + lVar6);
      uVar3 = *(uint *)((long)local_38.elems + lVar6);
      bVar7 = -(*puVar2 <= uVar3) | 1;
      lVar6 = lVar6 + -4;
    } while (*puVar2 == uVar3);
    bVar5 = bVar7 == 0;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_266_inc() -> bool
  {
    // See also: https://github.com/ckormanyos/wide-integer/issues/266

    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    local_uint128_t inc_value  ("0x0000000000000001FFFFFFFFFFFFFFFF");
    local_uint128_t inc_value_p(++(local_uint128_t(inc_value)));

    const auto result_is_ok = ((inc_value_p > inc_value) && (inc_value_p == local_uint128_t("0x00000000000000020000000000000000")));

    return result_is_ok;
  }